

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O3

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::removeHandle
          (cbtAxisSweep3Internal<unsigned_short> *this,unsigned_short handle,
          cbtDispatcher *dispatcher)

{
  ushort uVar1;
  ushort uVar2;
  Edge *pEVar3;
  unsigned_short uVar4;
  int iVar5;
  undefined6 in_register_00000032;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  lVar6 = (long)(this->m_pHandles->super_cbtBroadphaseProxy).m_aabbMin.m_floats +
          ((ulong)(uint)((int)CONCAT62(in_register_00000032,handle) * 0x48) - 0x14);
  iVar5 = (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback
            [0xf])();
  if ((char)iVar5 == '\0') {
    (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[4])
              (this->m_pairCache,lVar6,dispatcher);
  }
  auVar9._8_2_ = 0xfffe;
  auVar9._0_8_ = 0xfffefffefffefffe;
  auVar9._10_2_ = 0xfffe;
  auVar9._12_2_ = 0xfffe;
  auVar9._14_2_ = 0xfffe;
  uVar1 = this->m_numHandles;
  lVar7 = 0;
  auVar8 = vmovdqu16_avx512vl(*(undefined1 (*) [16])this->m_pHandles->m_maxEdges);
  auVar8 = vpaddw_avx(ZEXT616(auVar8._0_6_),auVar9);
  auVar8 = vmovdqu16_avx512vl(auVar8);
  *(undefined1 (*) [16])this->m_pHandles->m_maxEdges = auVar8;
  uVar4 = this->m_handleSentinel;
  do {
    pEVar3 = this->m_pEdges[lVar7];
    uVar2 = *(ushort *)(lVar6 + 0x3a + lVar7 * 2);
    pEVar3[uVar2].m_pos = uVar4;
    sortMaxUp(this,(int)lVar7,uVar2,dispatcher,false);
    uVar2 = *(ushort *)(lVar6 + 0x34 + lVar7 * 2);
    pEVar3[uVar2].m_pos = this->m_handleSentinel;
    sortMinUp(this,(int)lVar7,uVar2,dispatcher,false);
    pEVar3[(ulong)uVar1 * 2 + -1].m_handle = 0;
    lVar7 = lVar7 + 1;
    uVar4 = this->m_handleSentinel;
    pEVar3[(ulong)uVar1 * 2 + -1].m_pos = uVar4;
  } while (lVar7 != 3);
  *(unsigned_short *)
   &this->m_pHandles[CONCAT62(in_register_00000032,handle) & 0xffffffff].super_cbtBroadphaseProxy.
    field_0x34 = this->m_firstFreeHandle;
  this->m_firstFreeHandle = handle;
  this->m_numHandles = this->m_numHandles - 1;
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::removeHandle(BP_FP_INT_TYPE handle, cbtDispatcher* dispatcher)
{
	Handle* pHandle = getHandle(handle);

	//explicitly remove the pairs containing the proxy
	//we could do it also in the sortMinUp (passing true)
	///@todo: compare performance
	if (!m_pairCache->hasDeferredRemoval())
	{
		m_pairCache->removeOverlappingPairsContainingProxy(pHandle, dispatcher);
	}

	// compute current limit of edge arrays
	int limit = static_cast<int>(m_numHandles * 2);

	int axis;

	for (axis = 0; axis < 3; axis++)
	{
		m_pHandles[0].m_maxEdges[axis] -= 2;
	}

	// remove the edges by sorting them up to the end of the list
	for (axis = 0; axis < 3; axis++)
	{
		Edge* pEdges = m_pEdges[axis];
		BP_FP_INT_TYPE max = pHandle->m_maxEdges[axis];
		pEdges[max].m_pos = m_handleSentinel;

		sortMaxUp(axis, max, dispatcher, false);

		BP_FP_INT_TYPE i = pHandle->m_minEdges[axis];
		pEdges[i].m_pos = m_handleSentinel;

		sortMinUp(axis, i, dispatcher, false);

		pEdges[limit - 1].m_handle = 0;
		pEdges[limit - 1].m_pos = m_handleSentinel;

#ifdef DEBUG_BROADPHASE
		debugPrintAxis(axis, false);
#endif  //DEBUG_BROADPHASE
	}

	// free the handle
	freeHandle(handle);
}